

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaShrink6.c
# Opt level: O1

void Shr_ManComputeTruths
               (Gia_Man_t *p,int nVars,Vec_Int_t *vDivs,Vec_Wrd_t *vDivTruths,Vec_Wrd_t *vTruths)

{
  int iVar1;
  int iVar2;
  word Entry;
  long lVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  word *pwVar7;
  ulong uVar8;
  ulong uVar9;
  
  vDivTruths->nSize = 0;
  uVar9 = (ulong)(uint)nVars;
  if (0 < nVars) {
    pwVar7 = Truth;
    uVar8 = 0;
    do {
      if ((long)vDivs->nSize <= (long)uVar8) goto LAB_007c5636;
      iVar1 = vDivs->pArray[uVar8];
      if (((long)iVar1 < 0) || (vTruths->nSize <= iVar1)) goto LAB_007c55f8;
      Entry = *pwVar7;
      vTruths->pArray[iVar1] = Entry;
      Vec_WrdPush(vDivTruths,Entry);
      uVar8 = uVar8 + 1;
      pwVar7 = pwVar7 + 1;
    } while (uVar9 != uVar8);
  }
  if (nVars < vDivs->nSize) {
    do {
      if (nVars < 0) {
LAB_007c5636:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar1 = vDivs->pArray[uVar9];
      lVar4 = (long)iVar1;
      if ((lVar4 < 0) || (p->nObjs <= iVar1)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      lVar3 = *(long *)(p->pObjs + lVar4);
      uVar5 = iVar1 - ((uint)lVar3 & 0x1fffffff);
      if (((((int)uVar5 < 0) || (iVar2 = vTruths->nSize, iVar2 <= (int)uVar5)) ||
          (uVar6 = iVar1 - ((uint)((ulong)lVar3 >> 0x20) & 0x1fffffff), (int)uVar6 < 0)) ||
         (iVar2 <= (int)uVar6)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                      ,0x1ad,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
      }
      if (iVar2 <= iVar1) {
LAB_007c55f8:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                      ,0x1cf,"void Vec_WrdWriteEntry(Vec_Wrd_t *, int, word)");
      }
      pwVar7 = vTruths->pArray;
      uVar8 = ((lVar3 << 2) >> 0x3f ^ pwVar7[uVar6]) &
              ((long)((int)((uint)lVar3 * 4) >> 0x1f) ^ pwVar7[uVar5]);
      pwVar7[lVar4] = uVar8;
      Vec_WrdPush(vDivTruths,uVar8);
      uVar9 = uVar9 + 1;
    } while ((int)uVar9 < vDivs->nSize);
  }
  return;
}

Assistant:

void Shr_ManComputeTruths( Gia_Man_t * p, int nVars, Vec_Int_t * vDivs, Vec_Wrd_t * vDivTruths, Vec_Wrd_t * vTruths )
{
    Gia_Obj_t * pObj;
    word Truth0, Truth1;//, Truthh;
    int i, iDiv;
    Vec_WrdClear( vDivTruths );
    Vec_IntForEachEntryStop( vDivs, iDiv, i, nVars )
    {
        Vec_WrdWriteEntry( vTruths, iDiv, Truth[i] );
        Vec_WrdPush( vDivTruths, Truth[i] );
    }
    Vec_IntForEachEntryStart( vDivs, iDiv, i, nVars )
    {
        pObj = Gia_ManObj( p, iDiv );
        Truth0 = Vec_WrdEntry( vTruths, Gia_ObjFaninId0(pObj, iDiv) );
        Truth1 = Vec_WrdEntry( vTruths, Gia_ObjFaninId1(pObj, iDiv) );
        if ( Gia_ObjFaninC0(pObj) )
            Truth0 = ~Truth0;
        if ( Gia_ObjFaninC1(pObj) )
            Truth1 = ~Truth1;
        Vec_WrdWriteEntry( vTruths, iDiv, Truth0 & Truth1 );
        Vec_WrdPush( vDivTruths, Truth0 & Truth1 );

//        Truthh = Truth0 & Truth1;
//        Abc_TtPrintBinary( &Truthh, nVars );   //printf( "\n" );
//        Kit_DsdPrintFromTruth( &Truthh, nVars );    printf( "\n" );
    }
//    printf( "\n" );
}